

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O1

void __thiscall
dxil_spv::Converter::Impl::emit_builtin_interpolation_decorations
          (Impl *this,Id variable_id,Semantic semantic,InterpolationMode mode)

{
  int iVar1;
  undefined7 in_register_00000011;
  
  iVar1 = (int)CONCAT71(in_register_00000011,semantic);
  if ((iVar1 != 0xff) && (iVar1 != 0x1c)) {
    if (iVar1 != 3) {
      return;
    }
    if (mode == LinearNoperspective) {
      mode = Linear;
    }
    else if (mode == LinearNoperspectiveCentroid) {
      mode = LinearCentroid;
    }
    else if (mode == LinearNoperspectiveSample) {
      mode = LinearSample;
    }
  }
  emit_interpolation_decorations(this,variable_id,mode);
  return;
}

Assistant:

void Converter::Impl::emit_builtin_interpolation_decorations(spv::Id variable_id,
                                                             DXIL::Semantic semantic,
                                                             DXIL::InterpolationMode mode)
{
	switch (semantic)
	{
	case DXIL::Semantic::Barycentrics:
	case DXIL::Semantic::InternalBarycentricsNoPerspective:
		emit_interpolation_decorations(variable_id, mode);
		break;

	case DXIL::Semantic::Position:
		// DXIL emits NoPerspective here, but seems weird to emit that since it's kinda implied.
		// Normalize the interpolate mode first, then emit.
		if (mode == DXIL::InterpolationMode::LinearNoperspective)
			mode = DXIL::InterpolationMode::Linear;
		else if (mode == DXIL::InterpolationMode::LinearNoperspectiveCentroid)
			mode = DXIL::InterpolationMode::LinearCentroid;
		else if (mode == DXIL::InterpolationMode::LinearNoperspectiveSample)
			mode = DXIL::InterpolationMode::LinearSample;
		emit_interpolation_decorations(variable_id, mode);
		break;

	default:
		break;
	}
}